

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O1

void helper_vpmsumw_ppc64(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  uint64_t prod [4];
  
  lVar2 = 3;
  do {
    prod[lVar2] = 0;
    uVar1 = a->u32[lVar2];
    lVar3 = 0;
    do {
      if (((uint)(1L << ((byte)lVar3 & 0x3f)) & uVar1) != 0) {
        prod[lVar2] = prod[lVar2] ^ (ulong)b->u32[lVar2] << ((byte)lVar3 & 0x3f);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x20);
    bVar4 = lVar2 != 0;
    lVar2 = lVar2 + -1;
  } while (bVar4);
  lVar2 = 8;
  do {
    *(ulong *)((long)r + lVar2) =
         *(ulong *)((long)prod + lVar2 * 2 + 8) ^ *(ulong *)((long)prod + lVar2 * 2);
    lVar2 = lVar2 + -8;
  } while (lVar2 != -8);
  return;
}

Assistant:

void helper_vpmsumd(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b)
{

#ifdef CONFIG_INT128
    int i, j;
    __uint128_t prod[2];

    VECTOR_FOR_INORDER_I(i, u64) {
        prod[i] = 0;
        for (j = 0; j < 64; j++) {
            if (a->u64[i] & (1ull << j)) {
                prod[i] ^= (((__uint128_t)b->u64[i]) << j);
            }
        }
    }

    r->u128 = prod[0] ^ prod[1];

#else
    int i, j;
    ppc_avr_t prod[2];

    VECTOR_FOR_INORDER_I(i, u64) {
        prod[i].VsrD(1) = prod[i].VsrD(0) = 0;
        for (j = 0; j < 64; j++) {
            if (a->u64[i] & (1ull << j)) {
                ppc_avr_t bshift;
                if (j == 0) {
                    bshift.VsrD(0) = 0;
                    bshift.VsrD(1) = b->u64[i];
                } else {
                    bshift.VsrD(0) = b->u64[i] >> (64 - j);
                    bshift.VsrD(1) = b->u64[i] << j;
                }
                prod[i].VsrD(1) ^= bshift.VsrD(1);
                prod[i].VsrD(0) ^= bshift.VsrD(0);
            }
        }
    }

    r->VsrD(1) = prod[0].VsrD(1) ^ prod[1].VsrD(1);
    r->VsrD(0) = prod[0].VsrD(0) ^ prod[1].VsrD(0);
#endif
}